

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void __thiscall
HttpReqThread::HttpReqThread
          (HttpReqThread *this,vm_val_t *id,char *url,char *verb,int32_t options,char *hdrs,
          vm_val_t *body,char *body_type,vm_rcdesc *rc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  TadsMessageQueue *pTVar2;
  int iVar3;
  vm_globalvar_t *pvVar4;
  char *pcVar5;
  size_t mime_type_len_00;
  CVmDataSource *stream;
  OS_HttpPayload *this_00;
  CVmObject *this_01;
  unsigned_short uVar6;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  HttpReqThread *in_RDI;
  int32_t in_R8D;
  long in_R9;
  bool bVar7;
  int *in_stack_00000008;
  long in_stack_00000010;
  vm_rcdesc *in_stack_00000018;
  size_t mime_type_len;
  char *mime_type;
  CVmDataSource *s;
  char *def_mime_type;
  iter_body_table_ctx ctx;
  CVmObjLookupTable *tab;
  char *start;
  size_t pfx;
  size_t urll;
  char **in_stack_00000320;
  vm_val_t *in_stack_00000328;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  CVmObjTable *in_stack_fffffffffffffec0;
  _func_void_vm_val_t_ptr_vm_val_t_ptr_void_ptr *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  OS_HttpPayload *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  OS_HttpPayload *this_02;
  int local_b0;
  bool local_a9;
  iter_body_table_ctx local_70;
  CVmObject *local_60;
  char *local_58;
  long local_50;
  size_t local_48;
  long local_30;
  int32_t local_24;
  long local_20;
  long *local_18;
  undefined8 *local_10;
  
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = (long *)in_RDX;
  local_10 = in_RSI;
  OS_Thread::OS_Thread((OS_Thread *)in_stack_fffffffffffffec0);
  (in_RDI->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj =
       (_func_int **)&PTR__HttpReqThread_0042b718;
  (in_RDI->super_OS_Thread).super_OS_Waitable._vptr_OS_Waitable = (_func_int **)&DAT_0042b748;
  in_RDI->vmg = (vm_globals *)0x0;
  pTVar2 = G_net_queue_X;
  in_RDI->queue = G_net_queue_X;
  if (pTVar2 != (TadsMessageQueue *)0x0) {
    CVmRefCntObj::add_ref((CVmRefCntObj *)0x251ed6);
  }
  pvVar4 = CVmObjTable::create_global_var(in_stack_fffffffffffffec0);
  in_RDI->idg = pvVar4;
  pvVar4 = in_RDI->idg;
  aVar1 = *(anon_union_8_8_cb74652f_for_val *)(local_10 + 1);
  *(undefined8 *)&pvVar4->val = *local_10;
  (pvVar4->val).val = aVar1;
  in_RDI->options = local_24;
  local_48 = vmb_get_len((char *)0x251f4c);
  local_18 = (long *)((long)local_18 + 2);
  local_a9 = false;
  if (7 < local_48) {
    local_a9 = *local_18 == 0x2f2f3a7370747468;
  }
  in_RDI->https = (uint)local_a9;
  in_RDI->host = (char *)0x0;
  in_RDI->resource = (char *)0x0;
  uVar6 = 0x50;
  if (in_RDI->https != 0) {
    uVar6 = 0x1bb;
  }
  in_RDI->port = uVar6;
  if ((local_48 < 7) || (iVar3 = memcmp(local_18,"http://",7), iVar3 != 0)) {
    bVar7 = false;
    if (7 < local_48) {
      bVar7 = *local_18 == 0x2f2f3a7370747468;
    }
    local_b0 = 0;
    if (bVar7) {
      local_b0 = 8;
    }
  }
  else {
    local_b0 = 7;
  }
  local_50 = (long)local_b0;
  local_58 = (char *)(local_50 + (long)local_18);
  local_48 = local_48 - local_50;
  local_18 = (long *)local_58;
  while( true ) {
    bVar7 = false;
    if ((local_48 != 0) && (bVar7 = false, (char)*local_18 != ':')) {
      bVar7 = (char)*local_18 != '/';
    }
    if (!bVar7) break;
    local_18 = (long *)((long)local_18 + 1);
    local_48 = local_48 + -1;
  }
  pcVar5 = lib_copy_str(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
  in_RDI->host = pcVar5;
  if ((local_48 != 0) && ((char)*local_18 == ':')) {
    local_58 = (char *)((long)local_18 + 1);
    in_RDI->port = 0;
    local_18 = (long *)local_58;
    while( true ) {
      local_48 = local_48 + -1;
      bVar7 = false;
      if (local_48 != 0) {
        bVar7 = (char)*local_18 != '/';
      }
      if (!bVar7) break;
      iVar3 = is_digit(L'\0');
      if (iVar3 != 0) {
        uVar6 = in_RDI->port;
        iVar3 = value_of_digit((int)(char)*local_18);
        in_RDI->port = uVar6 * 10 + (short)iVar3;
      }
      local_18 = (long *)((long)local_18 + 1);
    }
  }
  if (local_48 == 0) {
    pcVar5 = lib_copy_str(in_stack_fffffffffffffeb0);
    in_RDI->resource = pcVar5;
  }
  else {
    pcVar5 = lib_copy_str(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
    in_RDI->resource = pcVar5;
  }
  mime_type_len_00 = local_20 + 2;
  stream = (CVmDataSource *)vmb_get_len((char *)0x252350);
  pcVar5 = lib_copy_str(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
  in_RDI->verb = pcVar5;
  if (local_30 == 0) {
    this_02 = (OS_HttpPayload *)0x0;
  }
  else {
    in_stack_fffffffffffffef0 = local_30 + 2;
    in_stack_fffffffffffffef8 = (char *)vmb_get_len((char *)0x2523ab);
    in_stack_fffffffffffffee8 =
         (OS_HttpPayload *)lib_copy_str(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0)
    ;
    this_02 = in_stack_fffffffffffffee8;
  }
  in_RDI->hdrs = (char *)this_02;
  in_RDI->body = (OS_HttpPayload *)0x0;
  if (in_stack_00000008 != (int *)0x0) {
    this_00 = (OS_HttpPayload *)operator_new(0x10);
    OS_HttpPayload::OS_HttpPayload(this_00);
    in_RDI->body = this_00;
    if ((*in_stack_00000008 == 5) &&
       (in_stack_fffffffffffffedc = CVmObjLookupTable::is_lookup_table_obj(0),
       in_stack_fffffffffffffedc != 0)) {
      this_01 = vm_objp(0);
      local_60 = this_01;
      iter_body_table_ctx::iter_body_table_ctx(&local_70,in_RDI,in_stack_00000018);
      CVmObjLookupTable::for_each
                ((CVmObjLookupTable *)this_01,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    else {
      val_to_ds(in_stack_00000328,in_stack_00000320);
      if (in_stack_00000010 != 0) {
        vmb_get_len((char *)0x252598);
      }
      OS_HttpPayload::add(this_02,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                          (char *)in_stack_fffffffffffffee8,(size_t)this_00,
                          (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          mime_type_len_00,stream);
    }
  }
  return;
}

Assistant:

HttpReqThread(VMG_ const vm_val_t *id, const char *url,
                  const char *verb, int32_t options,
                  const char *hdrs, vm_val_t *body, const char *body_type,
                  const vm_rcdesc *rc)
    {
        /* save the VM globals */
        vmg = VMGLOB_ADDR;

        /* add a reference on the net event queue */
        if ((queue = G_net_queue) != 0)
            queue->add_ref();

        /* create a global for the ID value */
        idg = G_obj_table->create_global_var();
        idg->val = *id;

        /* save the option flags */
        this->options = options;

        /* set up to parse the URL */
        size_t urll = vmb_get_len(url);
        url += VMB_LEN;

        /* note whether the scheme is plain http or https */
        https = (urll >= 8 && memcmp(url, "https://", 8) == 0);

        /* we don't have any URL pieces yet */
        host = 0;
        resource = 0;
        port = (https ? 443 : 80);

        /* skip the scheme prefix */
        size_t pfx = (urll >= 7 && memcmp(url, "http://", 7) == 0 ? 7 :
                      urll >= 8 && memcmp(url, "https://", 8) == 0 ? 8 : 0);
        url += pfx, urll -= pfx;

        /* the host name is the part up to the ':', '/', or end of string */
        const char *start;
        for (start = url ; urll > 0 && *url != ':' && *url != '/' ;
             ++url, --urll) ;

        /* save the host name */
        host = lib_copy_str(start, url - start);

        /* parse the port, if present */
        if (urll > 0 && *url == ':')
        {
            /* parse the port number string */
            for (--urll, start = ++url, port = 0 ; urll > 0 && *url != '/' ;
                 ++url, --urll)
            {
                if (is_digit(*url))
                    port = port*10 + value_of_digit(*url);
            }
        }

        /* 
         *   The rest (including the '/') is the resource string.  If there's
         *   nothing left, the resource is implicitly '/'. 
         */
        if (urll > 0)
            resource = lib_copy_str(url, urll);
        else
            resource = lib_copy_str("/");

        /* make null-terminated copies of the various strings */
        this->verb = lib_copy_str(verb + VMB_LEN, vmb_get_len(verb));
        this->hdrs = (hdrs == 0 ? 0 :
                      lib_copy_str(hdrs + VMB_LEN, vmb_get_len(hdrs)));

        /* if there's a content body, set up the payload */
        this->body = 0;
        if (body != 0)
        {
            /* set up an empty payload */
            this->body = new OS_HttpPayload();
            
            /* 
             *   Convert the body to a stream payload, if it's a string or
             *   ByteArray.  If it's a LookupTable, it's a set of form
             *   fields.
             */
            if (body->typ == VM_OBJ
                && CVmObjLookupTable::is_lookup_table_obj(vmg_ body->val.obj))
            {
                /* 
                 *   The body is a LookupTable, so we have a set of form
                 *   fields to encode as HTML form data. 
                 */
                
                /* cast the object value */
                CVmObjLookupTable *tab =
                    (CVmObjLookupTable *)vm_objp(vmg_ body->val.obj);
                
                /* add each key in the table as a form field */
                iter_body_table_ctx ctx(this, rc);
                tab->for_each(vmg_ iter_body_table, &ctx);
            }
            else
            {
                /* 
                 *   It's not a lookup table, so it must be bytes to upload,
                 *   as a string or ByteArray.
                 */
                const char *def_mime_type = 0;
                CVmDataSource *s = val_to_ds(vmg_ body, &def_mime_type);
                
                /* presume we're going to use the default mime type */
                const char *mime_type = def_mime_type;
                size_t mime_type_len =
                    (mime_type != 0 ? strlen(mime_type) : 0);

                /* if the caller specified a mime type, use it instead */
                if (body_type != 0)
                {
                    mime_type = body_type + VMB_LEN;
                    mime_type_len = vmb_get_len(body_type);
                }
                
                /* add the stream */
                this->body->add(
                    "", 0, "", 0, mime_type, mime_type_len, s);
            }
        }
    }